

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
internal_huf_decompress
          (exr_decode_pipeline_t *decode,uint8_t *compressed,uint64_t nCompressed,uint16_t *raw,
          uint64_t nRaw,void *spare,uint64_t sparebytes)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t im_00;
  int iVar3;
  HufDec *pHVar4;
  uint8_t **pcode;
  exr_const_context_t pctxt_00;
  exr_const_context_t in_RCX;
  undefined1 *in_RDX;
  uint8_t *in_RSI;
  HufDec *in_RDI;
  FastHufDecoder *in_R8;
  exr_const_context_t in_R9;
  HufDec *in_stack_00000008;
  uint16_t *in_stack_00000010;
  uint64_t nLeft;
  HufDec *hdec;
  uint64_t *freq;
  FastHufDecoder *fhd;
  uint64_t hufInfoBlockSize;
  exr_const_context_t pctxt;
  exr_result_t rv;
  uint8_t *ptr;
  uint64_t nBytes;
  uint32_t nBits;
  uint32_t iM;
  uint32_t im;
  uint32_t in_stack_00000738;
  uint32_t in_stack_0000073c;
  uint64_t in_stack_00000740;
  uint8_t **in_stack_00000748;
  FastHufDecoder *in_stack_00000750;
  exr_const_context_t in_stack_00000758;
  int in_stack_00000770;
  uint64_t *hcode;
  uint32_t *puVar5;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint32_t in_stack_ffffffffffffffb8;
  uint32_t rlc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar6;
  
  puVar5 = (uint32_t *)0x0;
  hcode = (uint64_t *)0x14;
  if (in_RDI != (HufDec *)0x0) {
    puVar5 = in_RDI[1].p;
  }
  if (in_RDX < (undefined1 *)0x14) {
    if (in_R8 == (FastHufDecoder *)0x0) {
      eVar6 = 0;
    }
    else {
      eVar6 = 3;
    }
  }
  else {
    pHVar4 = (HufDec *)internal_exr_huf_decompress_spare_bytes();
    if (in_stack_00000008 == pHVar4) {
      uVar1 = readUInt(in_RSI);
      uVar2 = readUInt(in_RSI + 4);
      im_00 = readUInt(in_RSI + 0xc);
      if ((uVar1 < 0x10001) && (uVar2 < 0x10001)) {
        pcode = (uint8_t **)(in_RSI + 0x14);
        pHVar4 = (HufDec *)((ulong)im_00 + 7 >> 3);
        if (in_RDX < &pHVar4[1].lit) {
          eVar6 = 1;
        }
        else {
          iVar3 = fasthuf_decode_enabled();
          if ((iVar3 == 0) || (im_00 < 0x81)) {
            pctxt_00 = (exr_const_context_t)(in_RDX + -0x14);
            hufClearDecTable((HufDec *)0x2526e3);
            rlc = (uint32_t)((ulong)in_RCX >> 0x20);
            hufUnpackEncTable(pcode,(uint64_t *)
                                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (uint32_t)((ulong)puVar5 >> 0x20),(uint32_t)puVar5,hcode);
            if ((ulong)((long)pctxt_00 << 3) < (ulong)im_00) {
              eVar6 = 0x17;
            }
            else {
              eVar6 = hufBuildDecTable(in_R9,(uint64_t *)CONCAT44(uVar1,uVar2),im_00,
                                       in_stack_ffffffffffffffb8,pHVar4);
              if (eVar6 == 0) {
                eVar6 = hufDecode((uint64_t *)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                  in_RDI,in_RSI,(uint64_t)in_RDX,rlc,(uint64_t)in_R8,
                                  in_stack_00000010);
              }
              hufFreeDecTable(pctxt_00,in_stack_00000008);
            }
          }
          else {
            eVar6 = fasthuf_initialize(in_stack_00000758,in_stack_00000750,in_stack_00000748,
                                       in_stack_00000740,in_stack_0000073c,in_stack_00000738,
                                       in_stack_00000770);
            if (eVar6 == 0) {
              if (in_RDX < (undefined1 *)(((long)pcode - (long)in_RSI) + (long)pHVar4)) {
                eVar6 = 1;
              }
              else {
                eVar6 = fasthuf_decode(in_RCX,in_R8,&in_R9->mode,CONCAT44(uVar1,uVar2),
                                       (uint16_t *)CONCAT44(im_00,in_stack_ffffffffffffffb8),
                                       (uint64_t)pHVar4);
              }
            }
          }
        }
      }
      else {
        eVar6 = 0x17;
      }
    }
    else {
      eVar6 = 3;
    }
  }
  return eVar6;
}

Assistant:

exr_result_t
internal_huf_decompress (
    exr_decode_pipeline_t* decode,
    const uint8_t*         compressed,
    uint64_t               nCompressed,
    uint16_t*              raw,
    uint64_t               nRaw,
    void*                  spare,
    uint64_t               sparebytes)
{
    uint32_t            im, iM, nBits;
    uint64_t            nBytes;
    const uint8_t*      ptr;
    exr_result_t        rv;
    exr_const_context_t pctxt            = NULL;
    const uint64_t      hufInfoBlockSize = 5 * sizeof (uint32_t);

    if (decode) pctxt = decode->context;
    //
    // need at least 20 bytes for header
    //
    if (nCompressed < 20)
    {
        if (nRaw != 0) return EXR_ERR_INVALID_ARGUMENT;
        return EXR_ERR_SUCCESS;
    }

    if (sparebytes != internal_exr_huf_decompress_spare_bytes ())
        return EXR_ERR_INVALID_ARGUMENT;

    im = readUInt (compressed);
    iM = readUInt (compressed + 4);
    // uint32_t tableLength = readUInt (compressed + 8);
    nBits = readUInt (compressed + 12);
    // uint32_t future = readUInt (compressed + 16);

    if (im >= HUF_ENCSIZE || iM >= HUF_ENCSIZE) return EXR_ERR_CORRUPT_CHUNK;

    ptr = compressed + hufInfoBlockSize;

    nBytes = (((uint64_t) (nBits) + 7)) / 8;

    // must be nBytes remaining in buffer
    if (hufInfoBlockSize + nBytes > nCompressed) return EXR_ERR_OUT_OF_MEMORY;

    //
    // Fast decoder needs at least 2x64-bits of compressed data, and
    // needs to be run-able on this platform. Otherwise, fall back
    // to the original decoder
    //
    if (fasthuf_decode_enabled () && nBits > 128)
    {
        FastHufDecoder* fhd = (FastHufDecoder*) spare;

        rv = fasthuf_initialize (
            pctxt, fhd, &ptr, nCompressed - hufInfoBlockSize, im, iM, (int) iM);
        if (rv == EXR_ERR_SUCCESS)
        {
            if ((uint64_t) (ptr - compressed) + nBytes > nCompressed)
                return EXR_ERR_OUT_OF_MEMORY;
            rv = fasthuf_decode (pctxt, fhd, ptr, nBits, raw, nRaw);
        }
    }
    else
    {
        uint64_t* freq  = (uint64_t*) spare;
        HufDec*   hdec  = (HufDec*) (freq + HUF_ENCSIZE);
        uint64_t  nLeft = nCompressed - 20;

        hufClearDecTable (hdec);
        hufUnpackEncTable (&ptr, &nLeft, im, iM, freq);

        if (nBits > 8 * nLeft) return EXR_ERR_CORRUPT_CHUNK;

        rv = hufBuildDecTable (pctxt, freq, im, iM, hdec);
        if (rv == EXR_ERR_SUCCESS)
            rv = hufDecode (freq, hdec, ptr, nBits, iM, nRaw, raw);

        hufFreeDecTable (pctxt, hdec);
    }
    return rv;
}